

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O3

void __thiscall Assimp::ASEImporter::BuildUniqueRepresentation(ASEImporter *this,Mesh *mesh)

{
  pointer paVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer paVar5;
  long lVar6;
  long lVar7;
  pointer paVar8;
  pointer pBVar9;
  void *pvVar10;
  float fVar11;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  uint n;
  uint (*pauVar17) [3];
  pointer pFVar18;
  long lVar19;
  ulong uVar20;
  float fVar21;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> mNormals;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> mVertexColors;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> mPositions;
  vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> mBoneVertices;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> amTexCoords [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_198;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> local_178;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_158;
  vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> local_138;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_118;
  ulong local_110;
  uint (*local_108) [3];
  ulong local_100;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_f8 [8];
  
  local_158.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(local_f8,0,0xc0);
  local_178.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar13 = (ulong)(uint)((int)((ulong)((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>
                                             ).mFaces.
                                             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>)
                                            .mFaces.
                                            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                        -0x45d1745d);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize(&local_158,uVar13);
  local_118 = mesh->amTexCoords;
  lVar19 = 0;
  do {
    if (*(long *)((long)&mesh->amTexCoords[0].
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar19) !=
        *(long *)((long)&mesh->amTexCoords[0].
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish + lVar19)) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 ((long)&local_f8[0].
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar19),uVar13);
    }
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0xc0);
  if ((mesh->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (mesh->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize(&local_178,uVar13);
  }
  if ((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize(&local_198,uVar13);
  }
  if ((mesh->mBoneVertices).
      super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (mesh->mBoneVertices).
      super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::resize
              (&local_138,uVar13);
  }
  pFVar18 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pFVar18 !=
      (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
      super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pauVar17 = pFVar18->amUVIndices;
    uVar13 = 0;
    uVar20 = 0;
    do {
      local_110 = uVar13;
      local_100 = (ulong)(uint)((int)uVar13 * 3);
      local_108 = pauVar17;
      lVar19 = 0;
      do {
        uVar15 = (pFVar18->super_FaceWithSmoothingGroup).mIndices[lVar19];
        paVar5 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_158.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_start[uVar20].z = *(float *)((long)(paVar5 + uVar15) + 8);
        paVar5 = paVar5 + uVar15;
        fVar2 = paVar5->y;
        local_158.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_start[uVar20].x = paVar5->x;
        local_158.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_start[uVar20].y = fVar2;
        lVar14 = 0;
        do {
          lVar6 = *(long *)((long)&mesh->amTexCoords[0].
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar14 * 2);
          if (lVar6 == *(long *)((long)&mesh->amTexCoords[0].
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + lVar14 * 2))
          break;
          uVar13 = (ulong)*(uint *)((long)*pauVar17 + lVar14);
          lVar7 = *(long *)((long)&local_f8[0].
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar14 * 2);
          *(undefined4 *)(lVar7 + 8 + uVar20 * 0xc) = *(undefined4 *)(lVar6 + 8 + uVar13 * 0xc);
          *(undefined8 *)(lVar7 + uVar20 * 0xc) = *(undefined8 *)(lVar6 + uVar13 * 0xc);
          lVar14 = lVar14 + 0xc;
        } while (lVar14 != 0x60);
        paVar8 = (mesh->mVertexColors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (paVar8 != (mesh->mVertexColors).
                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          paVar8 = paVar8 + pFVar18->mColorIndices[lVar19];
          fVar2 = paVar8->g;
          fVar21 = paVar8->b;
          fVar11 = paVar8->a;
          paVar1 = local_178.
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar20;
          paVar1->r = paVar8->r;
          paVar1->g = fVar2;
          paVar1->b = fVar21;
          paVar1->a = fVar11;
        }
        paVar5 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (paVar5 != (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          uVar15 = (int)local_100 + (int)lVar19;
          local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar20].z = paVar5[uVar15].z;
          fVar2 = paVar5[uVar15].y;
          local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar20].x = paVar5[uVar15].x;
          local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar20].y = fVar2;
          fVar2 = local_198.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar20].z;
          uVar3 = local_198.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar20].x;
          uVar4 = local_198.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar20].y;
          fVar21 = 1.0 / SQRT(fVar2 * fVar2 +
                              (float)uVar3 * (float)uVar3 + (float)uVar4 * (float)uVar4);
          local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar20].x = fVar21 * (float)uVar3;
          local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar20].y = fVar21 * (float)uVar4;
          local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar20].z = fVar2 * fVar21;
        }
        uVar13 = (ulong)(pFVar18->super_FaceWithSmoothingGroup).mIndices[lVar19];
        pBVar9 = (mesh->mBoneVertices).
                 super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar16 = ((long)(mesh->mBoneVertices).
                        super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar9 >> 3) *
                 -0x5555555555555555;
        if (uVar13 <= uVar16 && uVar16 - uVar13 != 0) {
          std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::operator=
                    (&local_138.
                      super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20].mBoneWeights,
                     &pBVar9[uVar13].mBoneWeights);
        }
        (pFVar18->super_FaceWithSmoothingGroup).mIndices[lVar19] = (uint32_t)uVar20;
        lVar19 = lVar19 + 1;
        uVar20 = (ulong)((uint32_t)uVar20 + 1);
        pauVar17 = (uint (*) [3])(*pauVar17 + 1);
      } while (lVar19 != 3);
      pFVar18 = pFVar18 + 1;
      uVar13 = (ulong)((int)local_110 + 1);
      pauVar17 = local_108 + 0xb;
    } while (pFVar18 !=
             (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
            (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals,&local_198);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)mesh,&local_158);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator=
            (&mesh->mVertexColors,&local_178);
  pvVar12 = local_118;
  lVar19 = 0;
  do {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               ((long)&(pvVar12->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar19),
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               ((long)&local_f8[0].
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar19));
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0xc0);
  std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::~vector
            (&local_138);
  if (local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar19 = 0xc0;
  do {
    pvVar10 = *(void **)((long)&local_110 + lVar19);
    if (pvVar10 != (void *)0x0) {
      operator_delete(pvVar10,*(long *)((long)local_f8 + lVar19 + -8) - (long)pvVar10);
    }
    lVar19 = lVar19 + -0x18;
  } while (lVar19 != 0);
  if (local_158.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ASEImporter::BuildUniqueRepresentation(ASE::Mesh& mesh)    {
    // allocate output storage
    std::vector<aiVector3D> mPositions;
    std::vector<aiVector3D> amTexCoords[AI_MAX_NUMBER_OF_TEXTURECOORDS];
    std::vector<aiColor4D>  mVertexColors;
    std::vector<aiVector3D> mNormals;
    std::vector<BoneVertex> mBoneVertices;

    unsigned int iSize = (unsigned int)mesh.mFaces.size() * 3;
    mPositions.resize(iSize);

    // optional texture coordinates
    for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)    {
        if (!mesh.amTexCoords[i].empty())   {
            amTexCoords[i].resize(iSize);
        }
    }
    // optional vertex colors
    if (!mesh.mVertexColors.empty())    {
        mVertexColors.resize(iSize);
    }

    // optional vertex normals (vertex normals can simply be copied)
    if (!mesh.mNormals.empty()) {
        mNormals.resize(iSize);
    }
    // bone vertices. There is no need to change the bone list
    if (!mesh.mBoneVertices.empty())    {
        mBoneVertices.resize(iSize);
    }

    // iterate through all faces in the mesh
    unsigned int iCurrent = 0, fi = 0;
    for (std::vector<ASE::Face>::iterator i =  mesh.mFaces.begin();i != mesh.mFaces.end();++i,++fi) {
        for (unsigned int n = 0; n < 3;++n,++iCurrent)
        {
            mPositions[iCurrent] = mesh.mPositions[(*i).mIndices[n]];

            // add texture coordinates
            for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c)    {
                if (mesh.amTexCoords[c].empty())break;
                amTexCoords[c][iCurrent] = mesh.amTexCoords[c][(*i).amUVIndices[c][n]];
            }
            // add vertex colors
            if (!mesh.mVertexColors.empty())    {
                mVertexColors[iCurrent] = mesh.mVertexColors[(*i).mColorIndices[n]];
            }
            // add normal vectors
            if (!mesh.mNormals.empty()) {
                mNormals[iCurrent] = mesh.mNormals[fi*3+n];
                mNormals[iCurrent].Normalize();
            }

            // handle bone vertices
            if ((*i).mIndices[n] < mesh.mBoneVertices.size())   {
                // (sometimes this will cause bone verts to be duplicated
                //  however, I' quite sure Schrompf' JoinVerticesStep
                //  will fix that again ...)
                mBoneVertices[iCurrent] =  mesh.mBoneVertices[(*i).mIndices[n]];
            }
            (*i).mIndices[n] = iCurrent;
        }
    }

    // replace the old arrays
    mesh.mNormals = mNormals;
    mesh.mPositions = mPositions;
    mesh.mVertexColors = mVertexColors;

    for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c)
        mesh.amTexCoords[c] = amTexCoords[c];
}